

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O3

Utest * __thiscall
TEST_WiningStateTest_RobbingQuad_TestShell::createTest
          (TEST_WiningStateTest_RobbingQuad_TestShell *this)

{
  TEST_WiningStateTest_RobbingQuad_Test *this_00;
  
  this_00 = (TEST_WiningStateTest_RobbingQuad_Test *)
            operator_new(0xc0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
                         ,0xa3);
  TEST_WiningStateTest_RobbingQuad_Test::TEST_WiningStateTest_RobbingQuad_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(WiningStateTest, RobbingQuad)
{
	addNoWiningHand();

	WinByDiscardSituation situation;
	situation.is_robbing_quad = true;

	winByDiscard(situation);
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::RobbingQuad));
	CHECK_EQUAL(1, r.doubling_factor);
}